

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O3

bool duckdb::TryDecimalAdd::Operation<int,int,int>(int32_t left,int32_t right,int32_t *result)

{
  if (right < 0) {
    if (-999999999 - right <= left) goto LAB_01415c85;
  }
  else if (left <= 999999999 - right) {
LAB_01415c85:
    *result = right + left;
    return true;
  }
  return false;
}

Assistant:

bool TryDecimalAddTemplated(T left, T right, T &result) {
	if (right < 0) {
		if (min - right > left) {
			return false;
		}
	} else {
		if (max - right < left) {
			return false;
		}
	}
	result = left + right;
	return true;
}